

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::SetCommonFieldVariables
          (FieldGeneratorBase *this,
          flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *variables)

{
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  uint uVar1;
  char *buffer;
  FieldDescriptor *this_01;
  ushort *puVar2;
  undefined8 uVar3;
  bool bVar4;
  Nonnull<char_*> pcVar5;
  byte *pbVar6;
  uint uVar7;
  uint uVar8;
  FieldDescriptor *descriptor;
  Descriptor *extraout_RDX;
  Descriptor *extraout_RDX_00;
  Descriptor *descriptor_00;
  long lVar9;
  anon_union_8_1_a8a14541_for_iterator_2 aVar10;
  anon_union_8_1_a8a14541_for_iterator_2 aVar11;
  AlphaNum *c;
  anon_union_8_1_a8a14541_for_iterator_2 *paVar12;
  int iVar13;
  char *pcVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  uint8_t tag_array [5];
  string tag_bytes;
  undefined1 local_1e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  slot_type local_1c0;
  AlphaNum local_190;
  byte local_15d [5];
  anon_union_8_1_a8a14541_for_iterator_2 local_158;
  anon_union_8_1_a8a14541_for_iterator_2 local_150;
  undefined1 local_148;
  undefined7 uStack_147;
  char *pcStack_140;
  anon_union_8_1_a8a14541_for_iterator_2 local_128;
  size_type local_120;
  slot_type local_118;
  anon_union_8_1_a8a14541_for_iterator_2 local_e8;
  anon_union_8_1_a8a14541_for_iterator_2 local_e0;
  undefined1 local_d8;
  undefined7 uStack_d7;
  char *pcStack_d0;
  anon_union_8_1_a8a14541_for_iterator_2 local_c8;
  uint local_bc;
  AlphaNum local_b8;
  anon_union_8_1_a8a14541_for_iterator_2 local_88;
  anon_union_8_1_a8a14541_for_iterator_2 local_80 [2];
  uint local_6c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  anon_union_8_1_a8a14541_for_iterator_2 local_48;
  anon_union_8_1_a8a14541_for_iterator_2 local_40;
  anon_union_8_1_a8a14541_for_iterator_2 local_38;
  
  this_01 = this->descriptor_;
  iVar15 = this_01->number_;
  uVar1 = iVar15 * 8 + 1;
  iVar13 = 0x1f;
  if (uVar1 != 0) {
    for (; uVar1 >> iVar13 == 0; iVar13 = iVar13 + -1) {
    }
  }
  uVar7 = iVar13 * 9 + 0x49U >> 6;
  local_6c = uVar7 << (this_01->type_ == '\n');
  uVar1 = local_6c >> 1;
  if (this_01->type_ != '\n') {
    uVar1 = uVar7;
  }
  local_118._32_8_ = this;
  bVar4 = FieldDescriptor::is_packed(this_01);
  uVar7 = 2;
  if (!bVar4) {
    uVar7 = *(uint *)(protobuf::internal::WireFormatLite::kWireTypeForFieldType +
                     (ulong)this_01->type_ * 4);
  }
  uVar7 = uVar7 | iVar15 << 3;
  pbVar6 = local_15d;
  uVar8 = uVar7;
  local_118._44_4_ = uVar7;
  local_c8 = (anon_union_8_1_a8a14541_for_iterator_2)variables;
  if (0x7f < uVar7) {
    do {
      *pbVar6 = (byte)uVar8 | 0x80;
      uVar7 = uVar8 >> 7;
      pbVar6 = pbVar6 + 1;
      bVar4 = 0x3fff < uVar8;
      uVar8 = uVar7;
    } while (bVar4);
  }
  *pbVar6 = (byte)uVar7;
  pcVar5 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                     ((uint)local_15d[0],(Nonnull<char_*>)&local_1d0);
  local_1e0._0_8_ = pcVar5 + -(long)&local_1d0;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_1e0._8_8_ = (slot_type *)&local_1d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,(slot_type *)&local_1d0,pcVar5);
  local_bc = uVar1;
  if (1 < uVar1) {
    uVar16 = 1;
    do {
      local_1e0._0_8_ = (ctrl_t *)0x2;
      local_1e0._8_8_ = ", ";
      pcVar14 = local_190.digits_;
      pcVar5 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                         ((uint)local_15d[uVar16],pcVar14);
      local_190.piece_._M_len = (size_t)(pcVar5 + -(long)pcVar14);
      local_190.piece_._M_str = pcVar14;
      absl::lts_20250127::StrAppend(&local_68,(AlphaNum *)local_1e0,&local_190);
      uVar16 = uVar16 + 1;
    } while (uVar1 != uVar16);
  }
  pcVar5 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                     (local_118._44_4_,(Nonnull<char_*>)&local_1d0);
  pcVar14 = local_190.digits_;
  local_1e0._0_8_ = pcVar5 + -(long)&local_1d0;
  local_1e0._8_8_ = (slot_type *)&local_1d0;
  local_190.piece_._M_len = (size_t)pcVar14;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_190,(slot_type *)&local_1d0,pcVar5);
  aVar11 = local_c8;
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[4]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_b8,local_c8.slot_,(char (*) [4])0x5d574c);
  std::__cxx11::string::operator=((string *)(local_b8.piece_._M_str + 0x10),(string *)&local_190);
  if ((char *)local_190.piece_._M_len != pcVar14) {
    operator_delete((void *)local_190.piece_._M_len,local_190.digits_._0_8_ + 1);
  }
  pcVar5 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                     (local_6c,(Nonnull<char_*>)&local_1d0);
  local_1e0._0_8_ = pcVar5 + -(long)&local_1d0;
  local_1e0._8_8_ = (slot_type *)&local_1d0;
  local_190.piece_._M_len = (size_t)pcVar14;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_190,(slot_type *)&local_1d0,pcVar5);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[9]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_b8,aVar11.slot_,(char (*) [9])"tag_size");
  std::__cxx11::string::operator=((string *)(local_b8.piece_._M_str + 0x10),(string *)&local_190);
  if ((char *)local_190.piece_._M_len != pcVar14) {
    operator_delete((void *)local_190.piece_._M_len,local_190.digits_._0_8_ + 1);
  }
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[10]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_1e0,aVar11.slot_,(char (*) [10])0x631eb7);
  std::__cxx11::string::_M_assign
            ((string *)
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_1e0._8_8_ + 0x10))->_M_local_buf);
  if ((*(FieldDescriptor **)(local_118._32_8_ + 0x10))->type_ == '\n') {
    iVar15 = (*(FieldDescriptor **)(local_118._32_8_ + 0x10))->number_;
    uVar1 = iVar15 * 8 + 4;
    uVar16 = (ulong)uVar1;
    if ((uint)(iVar15 << 3) < 0x80) {
      pbVar6 = local_15d;
    }
    else {
      pbVar6 = local_15d;
      do {
        uVar7 = (uint)uVar16;
        *pbVar6 = (byte)uVar16 | 0x80;
        uVar16 = uVar16 >> 7;
        pbVar6 = pbVar6 + 1;
      } while (0x3fff < uVar7);
    }
    *pbVar6 = (byte)uVar16;
    pcVar5 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                       ((uint)local_15d[0],(Nonnull<char_*>)&local_1d0);
    local_1e0._0_8_ = pcVar5 + -(long)&local_1d0;
    local_1e0._8_8_ = (slot_type *)&local_1d0;
    local_190.piece_._M_len = (size_t)pcVar14;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_190,(slot_type *)&local_1d0,pcVar5);
    local_118._44_4_ = uVar1;
    std::__cxx11::string::operator=((string *)&local_68,(string *)&local_190);
    if ((char *)local_190.piece_._M_len != pcVar14) {
      operator_delete((void *)local_190.piece_._M_len,local_190.digits_._0_8_ + 1);
    }
    if (1 < local_bc) {
      uVar16 = (ulong)local_bc;
      uVar17 = 1;
      do {
        local_1e0._0_8_ = (ctrl_t *)0x2;
        local_1e0._8_8_ = ", ";
        pcVar14 = local_190.digits_;
        pcVar5 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                           ((uint)local_15d[uVar17],pcVar14);
        local_190.piece_._M_len = (size_t)(pcVar5 + -(long)pcVar14);
        local_190.piece_._M_str = pcVar14;
        absl::lts_20250127::StrAppend(&local_68,(AlphaNum *)local_1e0,&local_190);
        uVar17 = uVar17 + 1;
      } while (uVar16 != uVar17);
    }
    pcVar5 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                       (local_118._44_4_,(Nonnull<char_*>)&local_1d0);
    local_1e0._0_8_ = pcVar5 + -(long)&local_1d0;
    local_1e0._8_8_ = (slot_type *)&local_1d0;
    local_190.piece_._M_len = (size_t)local_190.digits_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_190,(slot_type *)&local_1d0,pcVar5);
    this_00 = (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_118._32_8_ + 0x20);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[8]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_b8,this_00,(char (*) [8])"end_tag");
    aVar11 = local_c8;
    std::__cxx11::string::operator=((string *)(local_b8.piece_._M_str + 0x10),(string *)&local_190);
    if ((char *)local_190.piece_._M_len != local_190.digits_) {
      operator_delete((void *)local_190.piece_._M_len,local_190.digits_._0_8_ + 1);
    }
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[14]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_1e0,this_00,(char (*) [14])"end_tag_bytes");
    std::__cxx11::string::_M_assign
              ((string *)
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_1e0._8_8_ + 0x10))->_M_local_buf);
  }
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[13]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_1e0,aVar11.slot_,(char (*) [13])"access_level");
  c = (AlphaNum *)&DAT_00000006;
  std::__cxx11::string::_M_replace
            ((ulong)(local_1e0._8_8_ + 0x10),0,*(char **)(local_1e0._8_8_ + 0x18),0x5822ec);
  uVar3 = local_118._32_8_;
  GetPropertyName_abi_cxx11_
            ((string *)local_1e0,(csharp *)*(FieldDescriptor **)(local_118._32_8_ + 0x10),descriptor
            );
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[14]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_190,aVar11.slot_,(char (*) [14])0x631f76);
  std::__cxx11::string::operator=((string *)(local_190.piece_._M_str + 0x10),(string *)local_1e0);
  if ((slot_type *)local_1e0._0_8_ != (slot_type *)&local_1d0) {
    operator_delete((void *)local_1e0._0_8_,local_1d0._M_allocated_capacity + 1);
  }
  type_name_abi_cxx11_
            ((string *)local_1e0,(FieldGeneratorBase *)uVar3,*(FieldDescriptor **)(uVar3 + 0x10));
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[10]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_190,aVar11.slot_,(char (*) [10])0x6a5c78);
  std::__cxx11::string::operator=((string *)(local_190.piece_._M_str + 0x10),(string *)local_1e0);
  descriptor_00 = extraout_RDX;
  if ((slot_type *)local_1e0._0_8_ != (slot_type *)&local_1d0) {
    operator_delete((void *)local_1e0._0_8_,local_1d0._M_allocated_capacity + 1);
    descriptor_00 = extraout_RDX_00;
  }
  GetClassName_abi_cxx11_
            ((string *)local_1e0,(csharp *)(*(FieldDescriptor **)(uVar3 + 0x10))->containing_type_,
             descriptor_00);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[14]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_190,aVar11.slot_,(char (*) [14])"extended_type");
  std::__cxx11::string::operator=((string *)(local_190.piece_._M_str + 0x10),(string *)local_1e0);
  if ((slot_type *)local_1e0._0_8_ != (slot_type *)&local_1d0) {
    operator_delete((void *)local_1e0._0_8_,local_1d0._M_allocated_capacity + 1);
  }
  name_abi_cxx11_((string *)local_1e0,(FieldGeneratorBase *)uVar3);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[5]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_190,aVar11.slot_,(char (*) [5])0x7203be);
  std::__cxx11::string::operator=((string *)(local_190.piece_._M_str + 0x10),(string *)local_1e0);
  if ((slot_type *)local_1e0._0_8_ != (slot_type *)&local_1d0) {
    operator_delete((void *)local_1e0._0_8_,local_1d0._M_allocated_capacity + 1);
  }
  puVar2 = (ushort *)((*(FieldDescriptor **)(uVar3 + 0x10))->all_names_).payload_;
  local_1e0._0_8_ = (slot_type *)&local_1d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e0,(long)puVar2 + ~(ulong)*puVar2,(long)puVar2 + -1);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[16]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_190,aVar11.slot_,(char (*) [16])0x565102);
  std::__cxx11::string::operator=((string *)(local_190.piece_._M_str + 0x10),(string *)local_1e0);
  if ((slot_type *)local_1e0._0_8_ != (slot_type *)&local_1d0) {
    operator_delete((void *)local_1e0._0_8_,local_1d0._M_allocated_capacity + 1);
  }
  default_value_abi_cxx11_
            ((string *)local_1e0,(FieldGeneratorBase *)uVar3,*(FieldDescriptor **)(uVar3 + 0x10));
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[14]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_190,aVar11.slot_,(char (*) [14])0x6a5ca7);
  std::__cxx11::string::operator=((string *)(local_190.piece_._M_str + 0x10),(string *)local_1e0);
  if ((slot_type *)local_1e0._0_8_ != (slot_type *)&local_1d0) {
    operator_delete((void *)local_1e0._0_8_,local_1d0._M_allocated_capacity + 1);
  }
  capitalized_type_name_abi_cxx11_((string *)local_1e0,(FieldGeneratorBase *)uVar3);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[22]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_190,aVar11.slot_,(char (*) [22])"capitalized_type_name");
  std::__cxx11::string::operator=((string *)(local_190.piece_._M_str + 0x10),(string *)local_1e0);
  if ((slot_type *)local_1e0._0_8_ != (slot_type *)&local_1d0) {
    operator_delete((void *)local_1e0._0_8_,local_1d0._M_allocated_capacity + 1);
  }
  number_abi_cxx11_((string *)local_1e0,(FieldGeneratorBase *)uVar3);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[7]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_190,aVar11.slot_,(char (*) [7])0x6e9ba7);
  std::__cxx11::string::operator=((string *)(local_190.piece_._M_str + 0x10),(string *)local_1e0);
  if ((slot_type *)local_1e0._0_8_ != (slot_type *)&local_1d0) {
    operator_delete((void *)local_1e0._0_8_,local_1d0._M_allocated_capacity + 1);
  }
  bVar4 = has_default_value((FieldGeneratorBase *)uVar3);
  if ((!bVar4) ||
     (((*(FieldDescriptor **)(local_118._32_8_ + 0x10))->type_ != '\v' &&
      (bVar4 = FieldDescriptor::has_presence(*(FieldDescriptor **)(local_118._32_8_ + 0x10)), bVar4)
      ))) {
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[5]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_b8,aVar11.slot_,(char (*) [5])0x7203be);
    local_190.piece_._M_str = *(char **)(local_b8.piece_._M_str + 0x10);
    local_190.piece_._M_len = *(size_t *)(local_b8.piece_._M_str + 0x18);
    local_b8.piece_._M_len = 1;
    local_b8.piece_._M_str = "_";
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_158,(lts_20250127 *)&local_190,&local_b8,
               (AlphaNum *)local_190.piece_._M_str);
    local_1e0._0_8_ = (ctrl_t *)0x10;
    local_1e0._8_8_ = "name_def_message";
    if (local_158.slot_ == (slot_type *)&local_148) {
      local_1c0._8_8_ = pcStack_140;
      local_1d0._M_allocated_capacity = (size_type)&local_1c0;
    }
    else {
      local_1d0._M_allocated_capacity = (size_type)local_158;
    }
    local_1c0.value.first._M_len._1_7_ = uStack_147;
    local_1c0.value.first._M_len._0_1_ = local_148;
    local_1d0._8_8_ = local_150;
    local_150.slot_ = (slot_type *)0x0;
    local_148 = 0;
    paVar12 = &local_e8;
    local_158.slot_ = (slot_type *)&local_148;
    local_e8.slot_ = (slot_type *)local_1e0;
    local_e0.slot_ = (slot_type *)&local_1d0;
    local_88 = aVar11;
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::EmplaceDecomposable::operator()
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_128,&local_88,(basic_string_view<char,_std::char_traits<char>_> *)local_1e0
               ,(piecewise_construct_t *)&std::piecewise_construct,
               (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *)paVar12,
               (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
                *)&local_e0);
    if ((slot_type *)local_1d0._M_allocated_capacity != &local_1c0) {
      operator_delete((void *)local_1d0._M_allocated_capacity,local_1c0._0_8_ + 1);
    }
    if (local_158.slot_ != (slot_type *)&local_148) {
      lVar9 = CONCAT71(uStack_147,local_148);
      aVar10 = local_158;
      goto LAB_00316884;
    }
  }
  else {
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[5]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_b8,aVar11.slot_,(char (*) [5])0x7203be);
    local_190.piece_._M_str = *(char **)(local_b8.piece_._M_str + 0x10);
    local_190.piece_._M_len = *(size_t *)(local_b8.piece_._M_str + 0x18);
    local_b8.piece_._M_len = 4;
    local_b8.piece_._M_str = "_ = ";
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[14]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_e8,aVar11.slot_,(char (*) [14])0x6a5ca7);
    local_150 = (anon_union_8_1_a8a14541_for_iterator_2)
                ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)((long)local_e0.slot_ + 0x10))->_M_allocated_capacity;
    local_158 = *(anon_union_8_1_a8a14541_for_iterator_2 *)((long)local_e0.slot_ + 0x18);
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_128,(lts_20250127 *)&local_190,&local_b8,(AlphaNum *)&local_158,c);
    local_1e0._0_8_ = (ctrl_t *)0x10;
    local_1e0._8_8_ = "name_def_message";
    if (local_128.slot_ == &local_118) {
      local_1c0._8_8_ = local_118.value.first._M_str;
      local_1d0._M_allocated_capacity = (size_type)&local_1c0;
    }
    else {
      local_1d0._M_allocated_capacity = (size_type)local_128;
    }
    local_1c0.value.first._M_len._1_7_ = local_118.value.first._M_len._1_7_;
    local_1c0.value.first._M_len._0_1_ = local_118.value.first._M_len._0_1_;
    local_1d0._8_8_ = local_120;
    local_120 = 0;
    local_118.value.first._M_len._0_1_ = 0;
    paVar12 = &local_88;
    local_128.slot_ = &local_118;
    local_88.slot_ = (slot_type *)local_1e0;
    local_80[0].slot_ = (slot_type *)&local_1d0;
    local_48 = aVar11;
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::EmplaceDecomposable::operator()
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_e8,&local_48,(basic_string_view<char,_std::char_traits<char>_> *)local_1e0,
               (piecewise_construct_t *)&std::piecewise_construct,
               (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *)paVar12,
               (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
                *)local_80);
    if ((slot_type *)local_1d0._M_allocated_capacity != &local_1c0) {
      operator_delete((void *)local_1d0._M_allocated_capacity,local_1c0._0_8_ + 1);
    }
    if (local_128.slot_ != &local_118) {
      lVar9 = CONCAT71(local_118.value.first._M_len._1_7_,local_118.value.first._M_len._0_1_);
      aVar10 = local_128;
LAB_00316884:
      operator_delete(aVar10.slot_,lVar9 + 1);
    }
  }
  pcVar14 = local_190.digits_;
  if (((*(FieldDescriptor **)(local_118._32_8_ + 0x10))->type_ == '\v') ||
     (bVar4 = FieldDescriptor::has_presence(*(FieldDescriptor **)(local_118._32_8_ + 0x10)), !bVar4)
     ) {
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[14]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_b8,aVar11.slot_,(char (*) [14])0x631f76);
    local_190.piece_._M_str = *(char **)(local_b8.piece_._M_str + 0x10);
    local_190.piece_._M_len = *(size_t *)(local_b8.piece_._M_str + 0x18);
    local_b8.piece_._M_len = 4;
    local_b8.piece_._M_str = " != ";
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[14]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_e8,aVar11.slot_,(char (*) [14])0x6a5ca7);
    local_150 = (anon_union_8_1_a8a14541_for_iterator_2)
                ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)((long)local_e0.slot_ + 0x10))->_M_allocated_capacity;
    local_158 = *(anon_union_8_1_a8a14541_for_iterator_2 *)((long)local_e0.slot_ + 0x18);
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_128,(lts_20250127 *)&local_190,&local_b8,(AlphaNum *)&local_158,
               (AlphaNum *)paVar12);
    local_1e0._0_8_ = (ctrl_t *)0x12;
    local_1e0._8_8_ = "has_property_check";
    if (local_128.slot_ == &local_118) {
      local_1c0._8_8_ = local_118.value.first._M_str;
      local_1d0._M_allocated_capacity = (size_type)&local_1c0;
    }
    else {
      local_1d0._M_allocated_capacity = (size_type)local_128;
    }
    local_1c0.value.first._M_len._1_7_ = local_118.value.first._M_len._1_7_;
    local_1c0.value.first._M_len._0_1_ = local_118.value.first._M_len._0_1_;
    local_1d0._8_8_ = local_120;
    local_120 = 0;
    local_118.value.first._M_len._0_1_ = 0;
    local_48.slot_ = (slot_type *)local_c8;
    paVar12 = local_80;
    local_128.slot_ = &local_118;
    local_88.slot_ = (slot_type *)local_1e0;
    local_80[0].slot_ = (slot_type *)&local_1d0;
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::EmplaceDecomposable::operator()
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_e8,&local_48,(basic_string_view<char,_std::char_traits<char>_> *)local_1e0,
               (piecewise_construct_t *)&std::piecewise_construct,
               (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *)&local_88,
               (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
                *)paVar12);
    if ((slot_type *)local_1d0._M_allocated_capacity != &local_1c0) {
      operator_delete((void *)local_1d0._M_allocated_capacity,local_1c0._0_8_ + 1);
    }
    if (local_128.slot_ != &local_118) {
      operator_delete(local_128.slot_,
                      CONCAT71(local_118.value.first._M_len._1_7_,local_118.value.first._M_len._0_1_
                              ) + 1);
    }
    aVar11 = local_c8;
    local_190.piece_._M_len = (size_t)&DAT_00000006;
    local_190.piece_._M_str = "other.";
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[14]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_158,local_c8.slot_,(char (*) [14])0x631f76);
    local_b8.piece_._M_str = *(char **)((long)local_150.slot_ + 0x10);
    local_b8.piece_._M_len = *(undefined8 *)((long)local_150.slot_ + 0x18);
    local_158 = (anon_union_8_1_a8a14541_for_iterator_2)0x4;
    local_150.slot_ = (slot_type *)0x64bf0a;
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[14]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_88,aVar11.slot_,(char (*) [14])0x6a5ca7);
    local_120 = ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)((long)local_80[0].slot_ + 0x10))->_M_allocated_capacity;
    local_128 = *(anon_union_8_1_a8a14541_for_iterator_2 *)((long)local_80[0].slot_ + 0x18);
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_e8,(lts_20250127 *)&local_190,&local_b8,(AlphaNum *)&local_158,
               (AlphaNum *)&local_128,(AlphaNum *)paVar12);
    local_1e0._0_8_ = (ctrl_t *)0x18;
    local_1e0._8_8_ = "other_has_property_check";
    if (local_e8.slot_ == (slot_type *)&local_d8) {
      local_1c0._8_8_ = pcStack_d0;
      local_1d0._M_allocated_capacity = (size_type)&local_1c0;
    }
    else {
      local_1d0._M_allocated_capacity = (size_type)local_e8;
    }
    local_1c0.value.first._M_len._1_7_ = uStack_d7;
    local_1c0.value.first._M_len._0_1_ = local_d8;
    local_1d0._8_8_ = local_e0;
    local_e0.slot_ = (slot_type *)0x0;
    local_d8 = 0;
    local_38.slot_ = (slot_type *)local_c8;
    local_e8.slot_ = (slot_type *)&local_d8;
    local_48.slot_ = (slot_type *)local_1e0;
    local_40.slot_ = (slot_type *)&local_1d0;
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::EmplaceDecomposable::operator()
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_88,&local_38,(basic_string_view<char,_std::char_traits<char>_> *)local_1e0,
               (piecewise_construct_t *)&std::piecewise_construct,
               (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *)&local_48,
               (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
                *)&local_40);
    if ((slot_type *)local_1d0._M_allocated_capacity != &local_1c0) {
      operator_delete((void *)local_1d0._M_allocated_capacity,local_1c0._0_8_ + 1);
    }
    if (local_e8.slot_ == (slot_type *)&local_d8) goto LAB_00316c7c;
    lVar9 = CONCAT71(uStack_d7,local_d8);
    aVar11 = local_e8;
  }
  else {
    local_190.piece_._M_len = 3;
    local_190.piece_._M_str = "Has";
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[14]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_128,aVar11.slot_,(char (*) [14])0x631f76);
    local_b8.piece_._M_str = *(char **)(local_120 + 0x10);
    local_b8.piece_._M_len = *(size_t *)(local_120 + 0x18);
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_158,(lts_20250127 *)&local_190,&local_b8,
               (AlphaNum *)local_b8.piece_._M_str);
    local_1e0._0_8_ = (ctrl_t *)0x12;
    local_1e0._8_8_ = "has_property_check";
    if (local_158.slot_ == (slot_type *)&local_148) {
      local_1c0._8_8_ = pcStack_140;
      local_1d0._M_allocated_capacity = (size_type)&local_1c0;
    }
    else {
      local_1d0._M_allocated_capacity = (size_type)local_158;
    }
    local_1c0.value.first._M_len._1_7_ = uStack_147;
    local_1c0.value.first._M_len._0_1_ = local_148;
    local_1d0._8_8_ = local_150;
    local_150.slot_ = (slot_type *)0x0;
    local_148 = 0;
    local_e0.slot_ = (slot_type *)&local_1d0;
    local_158.slot_ = (slot_type *)&local_148;
    local_e8.slot_ = (slot_type *)local_1e0;
    local_88 = aVar11;
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::EmplaceDecomposable::operator()
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_128,&local_88,(basic_string_view<char,_std::char_traits<char>_> *)local_1e0
               ,(piecewise_construct_t *)&std::piecewise_construct,
               (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *)&local_e8,
               (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
                *)&local_e0);
    if ((slot_type *)local_1d0._M_allocated_capacity != &local_1c0) {
      operator_delete((void *)local_1d0._M_allocated_capacity,local_1c0._0_8_ + 1);
    }
    if (local_158.slot_ != (slot_type *)&local_148) {
      operator_delete(local_158.slot_,CONCAT71(uStack_147,local_148) + 1);
    }
    local_190.piece_._M_len = 9;
    local_190.piece_._M_str = "other.Has";
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[14]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_128,aVar11.slot_,(char (*) [14])0x631f76);
    local_b8.piece_._M_str = *(char **)(local_120 + 0x10);
    local_b8.piece_._M_len = *(size_t *)(local_120 + 0x18);
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_158,(lts_20250127 *)&local_190,&local_b8,
               (AlphaNum *)local_b8.piece_._M_str);
    local_1e0._0_8_ = (ctrl_t *)0x18;
    local_1e0._8_8_ = "other_has_property_check";
    if (local_158.slot_ == (slot_type *)&local_148) {
      local_1c0._8_8_ = pcStack_140;
      local_1d0._M_allocated_capacity = (size_type)&local_1c0;
    }
    else {
      local_1d0._M_allocated_capacity = (size_type)local_158;
    }
    local_1c0.value.first._M_len._1_7_ = uStack_147;
    local_1c0.value.first._M_len._0_1_ = local_148;
    local_1d0._8_8_ = local_150;
    local_150.slot_ = (slot_type *)0x0;
    local_148 = 0;
    local_e0.slot_ = (slot_type *)&local_1d0;
    local_158.slot_ = (slot_type *)&local_148;
    local_e8.slot_ = (slot_type *)local_1e0;
    local_88 = aVar11;
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::EmplaceDecomposable::operator()
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_128,&local_88,(basic_string_view<char,_std::char_traits<char>_> *)local_1e0
               ,(piecewise_construct_t *)&std::piecewise_construct,
               (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *)&local_e8,
               (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
                *)&local_e0);
    if ((slot_type *)local_1d0._M_allocated_capacity != &local_1c0) {
      operator_delete((void *)local_1d0._M_allocated_capacity,local_1c0._0_8_ + 1);
    }
    if (local_158.slot_ != (slot_type *)&local_148) {
      operator_delete(local_158.slot_,CONCAT71(uStack_147,local_148) + 1);
    }
    local_190.piece_._M_len = 1;
    local_190.piece_._M_str = "!";
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[19]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_128,aVar11.slot_,(char (*) [19])0x5d6f2c);
    local_b8.piece_._M_str = *(char **)(local_120 + 0x10);
    local_b8.piece_._M_len = *(size_t *)(local_120 + 0x18);
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_158,(lts_20250127 *)&local_190,&local_b8,
               (AlphaNum *)local_b8.piece_._M_str);
    local_1e0._0_8_ = (ctrl_t *)0x16;
    local_1e0._8_8_ = "has_not_property_check";
    if (local_158.slot_ == (slot_type *)&local_148) {
      local_1c0._8_8_ = pcStack_140;
      local_1d0._M_allocated_capacity = (size_type)&local_1c0;
    }
    else {
      local_1d0._M_allocated_capacity = (size_type)local_158;
    }
    local_1c0.value.first._M_len._1_7_ = uStack_147;
    local_1c0.value.first._M_len._0_1_ = local_148;
    local_1d0._8_8_ = local_150;
    local_150.slot_ = (slot_type *)0x0;
    local_148 = 0;
    local_e0.slot_ = (slot_type *)&local_1d0;
    local_158.slot_ = (slot_type *)&local_148;
    local_e8.slot_ = (slot_type *)local_1e0;
    local_88 = aVar11;
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::EmplaceDecomposable::operator()
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_128,&local_88,(basic_string_view<char,_std::char_traits<char>_> *)local_1e0
               ,(piecewise_construct_t *)&std::piecewise_construct,
               (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *)&local_e8,
               (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
                *)&local_e0);
    if ((slot_type *)local_1d0._M_allocated_capacity != &local_1c0) {
      operator_delete((void *)local_1d0._M_allocated_capacity,local_1c0._0_8_ + 1);
    }
    if (local_158.slot_ != (slot_type *)&local_148) {
      operator_delete(local_158.slot_,CONCAT71(uStack_147,local_148) + 1);
    }
    local_190.piece_._M_len = 1;
    local_190.piece_._M_str = "!";
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[25]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_128,aVar11.slot_,(char (*) [25])"other_has_property_check");
    local_b8.piece_._M_str = *(char **)(local_120 + 0x10);
    local_b8.piece_._M_len = *(undefined8 *)(local_120 + 0x18);
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_158,(lts_20250127 *)&local_190,&local_b8,
               (AlphaNum *)local_b8.piece_._M_str);
    local_1e0._0_8_ = (ctrl_t *)0x1c;
    local_1e0._8_8_ = "other_has_not_property_check";
    if (local_158.slot_ == (slot_type *)&local_148) {
      local_1c0._8_8_ = pcStack_140;
      local_1d0._M_allocated_capacity = (size_type)&local_1c0;
    }
    else {
      local_1d0._M_allocated_capacity = (size_type)local_158;
    }
    local_1c0.value.first._M_len._1_7_ = uStack_147;
    local_1c0.value.first._M_len._0_1_ = local_148;
    local_1d0._8_8_ = local_150;
    local_150.slot_ = (slot_type *)0x0;
    local_148 = 0;
    paVar12 = &local_e0;
    local_e0.slot_ = (slot_type *)&local_1d0;
    local_158.slot_ = (slot_type *)&local_148;
    local_e8.slot_ = (slot_type *)local_1e0;
    local_88 = aVar11;
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::EmplaceDecomposable::operator()
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_128,&local_88,(basic_string_view<char,_std::char_traits<char>_> *)local_1e0
               ,(piecewise_construct_t *)&std::piecewise_construct,
               (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *)&local_e8,
               (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
                *)paVar12);
    if ((slot_type *)local_1d0._M_allocated_capacity != &local_1c0) {
      operator_delete((void *)local_1d0._M_allocated_capacity,local_1c0._0_8_ + 1);
    }
    uVar3 = local_118._32_8_;
    if (local_158.slot_ != (slot_type *)&local_148) {
      operator_delete(local_158.slot_,CONCAT71(uStack_147,local_148) + 1);
    }
    iVar15 = *(int *)(uVar3 + 0x18);
    if (iVar15 == -1) goto LAB_00316c7c;
    iVar13 = iVar15 + 0x1f;
    if (-1 < iVar15) {
      iVar13 = iVar15;
    }
    iVar13 = iVar13 >> 5;
    iVar15 = 1 << ((byte)iVar15 & 0x1f);
    pcVar5 = absl::lts_20250127::numbers_internal::FastIntToBuffer(iVar13,pcVar14);
    local_190.piece_._M_len = (size_t)(pcVar5 + -(long)pcVar14);
    buffer = local_b8.digits_;
    local_190.piece_._M_str = pcVar14;
    pcVar5 = absl::lts_20250127::numbers_internal::FastIntToBuffer(iVar15,buffer);
    local_1c0.value.second._M_dataplus._M_p = (_Alloc_hider)(pcVar5 + -(long)buffer);
    local_1e0._0_8_ = (ctrl_t *)0x9;
    local_1e0._8_8_ = "(_hasBits";
    local_1d0._M_allocated_capacity = local_190.piece_._M_len;
    local_1d0._8_8_ = local_190.piece_._M_str;
    local_1c0._0_8_ = 3;
    local_1c0._8_8_ = " & ";
    local_1c0._32_8_ = 6;
    local_1c0._40_8_ = ") != 0";
    pieces._M_len = (size_type)" & ";
    pieces._M_array = (iterator)&DAT_00000005;
    local_1c0.value.second._M_string_length = (size_type)buffer;
    local_b8.piece_._M_len = (size_t)local_1c0.value.second._M_dataplus._M_p;
    local_b8.piece_._M_str = buffer;
    absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
              ((string *)&local_158,(strings_internal *)local_1e0,pieces);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[16]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_1e0,aVar11.slot_,(char (*) [16])"has_field_check");
    std::__cxx11::string::operator=((string *)(local_1e0._8_8_ + 0x10),(string *)&local_158);
    if (local_158.slot_ != (slot_type *)&local_148) {
      operator_delete(local_158.slot_,CONCAT71(uStack_147,local_148) + 1);
    }
    local_1e0._0_8_ = &DAT_00000008;
    local_1e0._8_8_ = "_hasBits";
    pcVar14 = local_190.digits_;
    pcVar5 = absl::lts_20250127::numbers_internal::FastIntToBuffer(iVar13,pcVar14);
    local_190.piece_._M_len = (size_t)(pcVar5 + -(long)pcVar14);
    local_b8.piece_._M_len = 4;
    local_b8.piece_._M_str = " |= ";
    local_190.piece_._M_str = pcVar14;
    pcVar5 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                       (iVar15,(Nonnull<char_*>)&local_148);
    local_158.slot_ = (slot_type *)(pcVar5 + -(long)&local_148);
    local_150.slot_ = (slot_type *)&local_148;
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_128,(lts_20250127 *)local_1e0,&local_190,&local_b8,
               (AlphaNum *)&local_158,(AlphaNum *)paVar12);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[14]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_e8,aVar11.slot_,(char (*) [14])"set_has_field");
    std::__cxx11::string::operator=
              ((string *)
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)local_e0.slot_ + 0x10))->_M_local_buf,(string *)&local_128);
    if (local_128.slot_ != &local_118) {
      operator_delete(local_128.slot_,
                      CONCAT71(local_118.value.first._M_len._1_7_,local_118.value.first._M_len._0_1_
                              ) + 1);
    }
    local_1e0._0_8_ = &DAT_00000008;
    local_1e0._8_8_ = "_hasBits";
    pcVar14 = local_190.digits_;
    pcVar5 = absl::lts_20250127::numbers_internal::FastIntToBuffer(iVar13,pcVar14);
    local_190.piece_._M_len = (size_t)(pcVar5 + -(long)pcVar14);
    local_b8.piece_._M_len = (size_t)&DAT_00000005;
    local_b8.piece_._M_str = " &= ~";
    local_190.piece_._M_str = pcVar14;
    pcVar5 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                       (iVar15,(Nonnull<char_*>)&local_148);
    local_158.slot_ = (slot_type *)(pcVar5 + -(long)&local_148);
    local_150.slot_ = (slot_type *)&local_148;
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_128,(lts_20250127 *)local_1e0,&local_190,&local_b8,
               (AlphaNum *)&local_158,(AlphaNum *)paVar12);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[16]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_e8,aVar11.slot_,(char (*) [16])"clear_has_field");
    std::__cxx11::string::operator=
              ((string *)
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)local_e0.slot_ + 0x10))->_M_local_buf,(string *)&local_128);
    if (local_128.slot_ == &local_118) goto LAB_00316c7c;
    lVar9 = CONCAT71(local_118.value.first._M_len._1_7_,local_118.value.first._M_len._0_1_);
    aVar11 = local_128;
  }
  operator_delete(aVar11.slot_,lVar9 + 1);
LAB_00316c7c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void FieldGeneratorBase::SetCommonFieldVariables(
    absl::flat_hash_map<absl::string_view, std::string>* variables) {
  // Note: this will be valid even though the tag emitted for packed and unpacked versions of
  // repeated fields varies by wire format. The wire format is encoded in the bottom 3 bits, which
  // never effects the tag size.
  int tag_size = internal::WireFormat::TagSize(descriptor_->number(), descriptor_->type());
  int part_tag_size = tag_size;
  if (descriptor_->type() == FieldDescriptor::TYPE_GROUP) {
    part_tag_size /= 2;
  }
  uint tag = internal::WireFormat::MakeTag(descriptor_);
  uint8_t tag_array[5];
  io::CodedOutputStream::WriteTagToArray(tag, tag_array);
  std::string tag_bytes = absl::StrCat(tag_array[0]);
  for (int i = 1; i < part_tag_size; i++) {
    absl::StrAppend(&tag_bytes, ", ", tag_array[i]);
  }

  (*variables)["tag"] = absl::StrCat(tag);
  (*variables)["tag_size"] = absl::StrCat(tag_size);
  (*variables)["tag_bytes"] = tag_bytes;

  if (descriptor_->type() == FieldDescriptor::Type::TYPE_GROUP) {
    tag = internal::WireFormatLite::MakeTag(
        descriptor_->number(),
        internal::WireFormatLite::WIRETYPE_END_GROUP);
    io::CodedOutputStream::WriteTagToArray(tag, tag_array);
    tag_bytes = absl::StrCat(tag_array[0]);
    for (int i = 1; i < part_tag_size; i++) {
      absl::StrAppend(&tag_bytes, ", ", tag_array[i]);
    }

    variables_["end_tag"] = absl::StrCat(tag);
    variables_["end_tag_bytes"] = tag_bytes;
  }

  (*variables)["access_level"] = "public";

  (*variables)["property_name"] = property_name();
  (*variables)["type_name"] = type_name();
  (*variables)["extended_type"] = GetClassName(descriptor_->containing_type());
  (*variables)["name"] = name();
  (*variables)["descriptor_name"] = std::string(descriptor_->name());
  (*variables)["default_value"] = default_value();
  (*variables)["capitalized_type_name"] = capitalized_type_name();
  (*variables)["number"] = number();
  if (has_default_value() && !SupportsPresenceApi(descriptor_)) {
    variables->insert({"name_def_message",
                       absl::StrCat((*variables)["name"],
                                    "_ = ", (*variables)["default_value"])});
  } else {
    variables->insert(
        {"name_def_message", absl::StrCat((*variables)["name"], "_")});
  }
  if (SupportsPresenceApi(descriptor_)) {
    variables->insert({"has_property_check",
                       absl::StrCat("Has", (*variables)["property_name"])});
    variables->insert(
        {"other_has_property_check",
         absl::StrCat("other.Has", (*variables)["property_name"])});
    variables->insert({"has_not_property_check",
                       absl::StrCat("!", (*variables)["has_property_check"])});
    variables->insert(
        {"other_has_not_property_check",
         absl::StrCat("!", (*variables)["other_has_property_check"])});
    if (presenceIndex_ != -1) {
        const int hasBitsNumber = presenceIndex_ / 32;
        const int hasBitsMask = 1 << (presenceIndex_ % 32);
        (*variables)["has_field_check"] = absl::StrCat(
            "(_hasBits", hasBitsNumber, " & ", hasBitsMask, ") != 0");
        (*variables)["set_has_field"] =
            absl::StrCat("_hasBits", hasBitsNumber, " |= ", hasBitsMask);
        (*variables)["clear_has_field"] =
            absl::StrCat("_hasBits", hasBitsNumber, " &= ~", hasBitsMask);
    }
  } else {
    variables->insert({"has_property_check",
                       absl::StrCat((*variables)["property_name"],
                                    " != ", (*variables)["default_value"])});
    variables->insert({"other_has_property_check",
                       absl::StrCat("other.", (*variables)["property_name"],
                                    " != ", (*variables)["default_value"])});
  }
}